

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O1

Gia_Man_t * Gia_SweeperFraigTest(Gia_Man_t *pInit,int nWords,int nConfs,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  Gia_Man_t *pGia;
  Vec_Int_t *vProbeOuts;
  int *piVar4;
  Vec_Int_t *pVVar5;
  Gia_Man_t *pGVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  
  pGia = Gia_ManDupOneHot(pInit);
  Gia_SweeperStart(pGia);
  iVar10 = pGia->vCos->nSize - pGia->nRegs;
  vProbeOuts = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar3 = iVar10;
  }
  vProbeOuts->nSize = 0;
  vProbeOuts->nCap = iVar3;
  if (iVar3 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar3 << 2);
  }
  vProbeOuts->pArray = piVar4;
  pVVar5 = pGia->vCos;
  uVar2 = pVVar5->nSize;
  uVar9 = (ulong)uVar2;
  uVar7 = uVar2 - pGia->nRegs;
  uVar8 = (ulong)uVar7;
  if (uVar7 != 0 && pGia->nRegs <= (int)uVar2) {
    lVar11 = 0;
    do {
      if ((int)uVar9 <= lVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = pVVar5->pArray[lVar11];
      if (((long)iVar3 < 0) || (iVar10 = pGia->nObjs, iVar10 <= iVar3)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGia->pObjs + iVar3;
      if (lVar11 < (long)(int)uVar8 - (long)pGia->nConstrs) {
        if (iVar10 <= iVar3) {
LAB_00777cd4:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar2 = *(uint *)pGVar1;
        iVar3 = iVar3 - (uVar2 & 0x1fffffff);
        if (iVar3 < 0) {
LAB_00777cb5:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf1,"int Abc_Var2Lit(int, int)");
        }
        iVar3 = Gia_SweeperProbeCreate(pGia,(uVar2 >> 0x1d & 1) + iVar3 * 2);
        pVVar5 = vProbeOuts;
      }
      else {
        if (iVar10 <= iVar3) goto LAB_00777cd4;
        uVar2 = *(uint *)pGVar1;
        iVar3 = iVar3 - (uVar2 & 0x1fffffff);
        if (iVar3 < 0) goto LAB_00777cb5;
        iVar3 = Gia_SweeperProbeCreate(pGia,(uVar2 >> 0x1d & 1) + iVar3 * 2);
        pVVar5 = *(Vec_Int_t **)((long)pGia->pData + 0x18);
      }
      Vec_IntPush(pVVar5,iVar3);
      lVar11 = lVar11 + 1;
      pVVar5 = pGia->vCos;
      uVar9 = (ulong)pVVar5->nSize;
      uVar8 = uVar9 - (long)pGia->nRegs;
    } while (lVar11 < (long)uVar8);
  }
  pGVar6 = Gia_SweeperSweep(pGia,vProbeOuts,nWords,nConfs,fVerbose,0);
  if (vProbeOuts->pArray != (int *)0x0) {
    free(vProbeOuts->pArray);
    vProbeOuts->pArray = (int *)0x0;
  }
  free(vProbeOuts);
  Gia_SweeperStop(pGia);
  Gia_ManStop(pGia);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_SweeperFraigTest( Gia_Man_t * pInit, int nWords, int nConfs, int fVerbose )
{
    Gia_Man_t * p, * pGia;
    Gia_Obj_t * pObj;
    Vec_Int_t * vOuts;
    int i;
    // add one-hotness constraints
    p = Gia_ManDupOneHot( pInit );
    // create sweeper
    Gia_SweeperStart( p );
    // collect outputs and create conditions
    vOuts = Vec_IntAlloc( Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
        if ( i < Gia_ManPoNum(p) - p->nConstrs )  // this is the user's output
            Vec_IntPush( vOuts, Gia_SweeperProbeCreate( p,  Gia_ObjFaninLit0p(p, pObj) ) );
        else // this is a constraint
            Gia_SweeperCondPush( p, Gia_SweeperProbeCreate( p, Gia_ObjFaninLit0p(p, pObj) ) );
    // perform the sweeping
    pGia = Gia_SweeperSweep( p, vOuts, nWords, nConfs, fVerbose, 0 );
//    pGia = Gia_ManDup( p );
    Vec_IntFree( vOuts );
    // sop the sweeper
    Gia_SweeperStop( p );
    Gia_ManStop( p );
    return pGia;
}